

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

int rgbcx::init(EVP_PKEY_CTX *ctx)

{
  uint32_t i_2;
  uint uVar1;
  char cVar2;
  int i;
  long lVar3;
  uint uVar4;
  long lVar5;
  bc1_approx_mode mode;
  byte *pbVar6;
  float fVar7;
  float fVar8;
  byte local_8c [4];
  uint8_t bc1_expand5 [32];
  uint8_t bc1_expand6 [64];
  
  mode = (bc1_approx_mode)ctx;
  uVar1 = 0;
  cVar2 = '\0';
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
    bc1_expand5[lVar3] = (char)(uVar1 >> 2) + cVar2;
    cVar2 = cVar2 + '\b';
    uVar1 = uVar1 + 1;
  }
  g_bc1_approx_mode = mode;
  prepare_bc1_single_color_table((bc1_match_entry *)g_bc1_match5_equals_1,bc1_expand5,0x20,mode);
  prepare_bc1_single_color_table_half((bc1_match_entry *)g_bc1_match5_half,bc1_expand5,0x20,mode);
  uVar1 = 0;
  cVar2 = '\0';
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 1) {
    bc1_expand6[lVar3] = (char)(uVar1 >> 4) + cVar2;
    cVar2 = cVar2 + '\x04';
    uVar1 = uVar1 + 1;
  }
  prepare_bc1_single_color_table((bc1_match_entry *)g_bc1_match6_equals_1,bc1_expand6,0x40,mode);
  prepare_bc1_single_color_table_half((bc1_match_entry *)g_bc1_match6_half,bc1_expand6,0x40,mode);
  for (lVar3 = 0; lVar3 != 0x3c9; lVar3 = lVar3 + 1) {
    local_8c[0] = (&g_unique_total_orders4)[lVar3 * 4];
    local_8c[1] = (&DAT_00120201)[lVar3 * 4];
    local_8c[2] = (&DAT_00120202)[lVar3 * 4];
    local_8c[3] = (&DAT_00120203)[lVar3 * 4];
    if (((&DAT_00120203)[lVar3 * 4] != '\x10' && local_8c[2] != 0x10) &&
        (local_8c[1] != 0x10 && local_8c[0] != 0x10)) {
      *(short *)(g_total_ordering4_hash +
                ((uint)local_8c[2] << 9 | (uint)local_8c[1] << 5 | (uint)local_8c[0] * 2)) =
           (short)lVar3;
    }
    uVar1 = 0;
    pbVar6 = local_8c;
    for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
      uVar1 = uVar1 + (uint)*pbVar6 * *(int *)((long)&g_weight_vals4 + lVar5);
      pbVar6 = pbVar6 + 1;
    }
    fVar7 = (float)(uVar1 >> 0x10 & 0xff);
    uVar4 = uVar1 >> 8 & 0xff;
    fVar8 = fVar7 * (float)(uVar1 & 0xff) - (float)(uVar4 * uVar4);
    fVar8 = (float)(~-(uint)(ABS(fVar8) < 1e-08) & (uint)(0.011764706 / fVar8));
    *(ulong *)((long)&g_selector_factors4 + lVar3 * 0xc) =
         CONCAT44(-(float)uVar4 * fVar8,(float)(uVar1 & 0xff) * fVar8);
    (&DAT_0016a5b8)[lVar3 * 3] = fVar8 * fVar7;
  }
  for (lVar3 = 0; lVar3 != 0x99; lVar3 = lVar3 + 1) {
    lVar5 = lVar3 * 3;
    local_8c[0] = (&g_unique_total_orders3)[lVar5];
    local_8c[1] = (&DAT_00121131)[lVar5];
    local_8c[2] = (&DAT_00121132)[lVar5];
    if ((&DAT_00121132)[lVar5] != '\x10' && (local_8c[1] != 0x10 && local_8c[0] != 0x10)) {
      *(short *)(g_total_ordering3_hash + ((uint)local_8c[1] << 5 | (uint)local_8c[0] * 2)) =
           (short)lVar3;
    }
    uVar1 = 0;
    pbVar6 = local_8c;
    for (lVar5 = 0; lVar5 != 0xc; lVar5 = lVar5 + 4) {
      uVar1 = uVar1 + (uint)*pbVar6 * *(int *)((long)&g_weight_vals3 + lVar5);
      pbVar6 = pbVar6 + 1;
    }
    fVar7 = (float)(uVar1 >> 0x10 & 0xff);
    uVar4 = uVar1 >> 8 & 0xff;
    fVar8 = fVar7 * (float)(uVar1 & 0xff) - (float)(uVar4 * uVar4);
    fVar8 = (float)(~-(uint)(ABS(fVar8) < 1e-08) & (uint)(0.007843138 / fVar8));
    *(ulong *)((long)&g_selector_factors3 + lVar3 * 0xc) =
         CONCAT44(-(float)uVar4 * fVar8,(float)(uVar1 & 0xff) * fVar8);
    (&DAT_0016d528)[lVar3 * 3] = fVar8 * fVar7;
  }
  return 0x99;
}

Assistant:

void init(bc1_approx_mode mode)
	{
		g_bc1_approx_mode = mode;
								
		uint8_t bc1_expand5[32];
		for (int i = 0; i < 32; i++)
			bc1_expand5[i] = static_cast<uint8_t>((i << 3) | (i >> 2));
		prepare_bc1_single_color_table(g_bc1_match5_equals_1, bc1_expand5, 32, mode);
		prepare_bc1_single_color_table_half(g_bc1_match5_half, bc1_expand5, 32, mode);

		uint8_t bc1_expand6[64];
		for (int i = 0; i < 64; i++)
			bc1_expand6[i] = static_cast<uint8_t>((i << 2) | (i >> 4));
		prepare_bc1_single_color_table(g_bc1_match6_equals_1, bc1_expand6, 64, mode);
		prepare_bc1_single_color_table_half(g_bc1_match6_half, bc1_expand6, 64, mode);

		for (uint32_t i = 0; i < NUM_UNIQUE_TOTAL_ORDERINGS4; i++)
		{
			hist4 h;
			h.m_hist[0] = (uint8_t)g_unique_total_orders4[i][0];
			h.m_hist[1] = (uint8_t)g_unique_total_orders4[i][1];
			h.m_hist[2] = (uint8_t)g_unique_total_orders4[i][2];
			h.m_hist[3] = (uint8_t)g_unique_total_orders4[i][3];
			
			if (!h.any_16())
			{
				const uint32_t index = h.m_hist[0] | (h.m_hist[1] << 4) | (h.m_hist[2] << 8);
				assert(index < 4096);
				g_total_ordering4_hash[index] = (uint16_t)i;
			}

			compute_selector_factors4(h, g_selector_factors4[i][0], g_selector_factors4[i][1], g_selector_factors4[i][2]);
		}

		for (uint32_t i = 0; i < NUM_UNIQUE_TOTAL_ORDERINGS3; i++)
		{
			hist3 h;
			h.m_hist[0] = (uint8_t)g_unique_total_orders3[i][0];
			h.m_hist[1] = (uint8_t)g_unique_total_orders3[i][1];
			h.m_hist[2] = (uint8_t)g_unique_total_orders3[i][2];
			
			if (!h.any_16())
			{
				const uint32_t index = h.m_hist[0] | (h.m_hist[1] << 4);
				assert(index < 256);
				g_total_ordering3_hash[index] = (uint16_t)i;
			}

			compute_selector_factors3(h, g_selector_factors3[i][0], g_selector_factors3[i][1], g_selector_factors3[i][2]);
		}

		g_initialized = true;
	}